

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

bool __thiscall
VertexAttrib64Bit::GetVertexAttribTest::verifyResults
          (GetVertexAttribTest *this,GLdouble *set_values,GLuint length,GLuint index,
          char *function_name,int line_number)

{
  bool bVar1;
  GLenum err;
  GLdouble local_58;
  GLdouble results [4];
  int line_number_local;
  char *function_name_local;
  GLuint index_local;
  GLuint length_local;
  GLdouble *set_values_local;
  GetVertexAttribTest *this_local;
  
  results[3]._4_4_ = line_number;
  memset(&local_58,0,0x20);
  (*(this->super_Base).gl.getVertexAttribLdv)(index,0x8626,&local_58);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"GetVertexAttribLdv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x477);
  bVar1 = compareDoubles(this,set_values,&local_58,length);
  if (!bVar1) {
    logError(this,set_values,&local_58,length,function_name,index,results[3]._4_4_);
  }
  return bVar1;
}

Assistant:

bool GetVertexAttribTest::verifyResults(const GLdouble* set_values, GLuint length, GLuint index,
										const char* function_name, int line_number) const
{
	GLdouble results[4] = { 0.0, 0.0, 0.0, 0.0 };

	gl.getVertexAttribLdv(index, GL_CURRENT_VERTEX_ATTRIB, results);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribLdv");

	if (false == compareDoubles(set_values, results, length))
	{
		logError(set_values, results, length, function_name, index, line_number);

		return false;
	}

	return true;
}